

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# removed_api.cpp
# Opt level: O2

void __thiscall
QFutureInterfaceBase::setContinuation
          (QFutureInterfaceBase *this,function<void_(const_QFutureInterfaceBase_&)> func,
          QFutureInterfaceBasePrivate *continuationFutureData)

{
  long lVar1;
  QFutureCallOutInterface **ppQVar2;
  Data *pDVar3;
  function<void_(const_QFutureInterfaceBase_&)> func_00;
  ContinuationType in_DL;
  long in_FS_OFFSET;
  undefined8 uVar4;
  undefined8 uVar5;
  Data *pDVar6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = (__pointer_type)0x0;
  uVar5 = (__pointer_type)0x0;
  ppQVar2 = (continuationFutureData->outputConnections).d.ptr;
  pDVar3 = (continuationFutureData->outputConnections).d.d;
  pDVar6 = (Data *)0x0;
  if (pDVar3 != (Data *)0x0) {
    uVar4 = (continuationFutureData->m_mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p;
    uVar5 = (continuationFutureData->continuationMutex).d_ptr._q_value._M_b._M_p;
    (continuationFutureData->outputConnections).d.d = (Data *)0x0;
    (continuationFutureData->outputConnections).d.ptr = (QFutureCallOutInterface **)0x0;
    pDVar6 = pDVar3;
  }
  func_00.super__Function_base._M_functor._8_8_ = uVar5;
  func_00.super__Function_base._M_functor._M_unused._M_object = (void *)uVar4;
  func_00.super__Function_base._M_manager = (_Manager_type)pDVar6;
  func_00._M_invoker = (_Invoker_type)ppQVar2;
  setContinuation(this,func_00,&stack0xffffffffffffffc8,in_DL);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffffc8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFutureInterfaceBase::setContinuation(std::function<void(const QFutureInterfaceBase &)> func,
                                           QFutureInterfaceBasePrivate *continuationFutureData)
{
    // Backwards compatibility - the continuation data was used for
    // then-continuations
    setContinuation(std::move(func), continuationFutureData, ContinuationType::Then);
}